

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImDrawList::~ImDrawList(ImDrawList *this)

{
  ImDrawChannel *pIVar1;
  ImVec2 *pIVar2;
  void **ppvVar3;
  ImVec4 *pIVar4;
  ImDrawVert *pIVar5;
  unsigned_short *puVar6;
  ImDrawCmd *pIVar7;
  
  ClearFreeMemory(this);
  pIVar1 = (this->_Channels).Data;
  if (pIVar1 != (ImDrawChannel *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pIVar1,GImAllocatorUserData);
  }
  pIVar2 = (this->_Path).Data;
  if (pIVar2 != (ImVec2 *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
  }
  ppvVar3 = (this->_TextureIdStack).Data;
  if (ppvVar3 != (void **)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(ppvVar3,GImAllocatorUserData);
  }
  pIVar4 = (this->_ClipRectStack).Data;
  if (pIVar4 != (ImVec4 *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
  }
  pIVar5 = (this->VtxBuffer).Data;
  if (pIVar5 != (ImDrawVert *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
  }
  puVar6 = (this->IdxBuffer).Data;
  if (puVar6 != (unsigned_short *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
  }
  pIVar7 = (this->CmdBuffer).Data;
  if (pIVar7 != (ImDrawCmd *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
  }
  return;
}

Assistant:

~ImDrawList() { ClearFreeMemory(); }